

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O1

VRCodeGraphIterator * __thiscall
dg::vr::VRCodeGraph::begin(VRCodeGraphIterator *__return_storage_ptr__,VRCodeGraph *this)

{
  _Rb_tree_header *p_Var1;
  
  if (*(long *)&this->field_0x40 == 0) {
    p_Var1 = &(__return_storage_ptr__->intoFunction).super_LazyVisit.visited._M_t._M_impl.
              super__Rb_tree_header;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->intoFunction).super_LazyVisit.visited._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->intoFunction).super_LazyVisit.visited._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) = (_Base_ptr)0x0;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->intoFunction).super_LazyVisit.visited._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) = (_Base_ptr)0x0;
    (__return_storage_ptr__->intoFunction).super_LazyVisit.visited._M_t._M_impl.
    super__Rb_tree_header._M_node_count = 0;
    (__return_storage_ptr__->intoFunction).stack.
    super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->intoFunction).stack.
    super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->intoFunction).function = (Function *)0x0;
    (__return_storage_ptr__->intoFunction).stack.
    super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined8 *)&(__return_storage_ptr__->intoFunction).dir = 0;
    *(undefined8 *)&(__return_storage_ptr__->intoFunction).super_LazyVisit.visited._M_t._M_impl = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->intoFunction).super_LazyVisit.visited._M_t._M_impl.
      super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->intoMapping)._M_node = (_Base_ptr)0x0;
    (__return_storage_ptr__->endMapping)._M_node = (_Base_ptr)0x0;
    *(_Rb_tree_header **)
     ((long)&(__return_storage_ptr__->intoFunction).super_LazyVisit.visited._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) = p_Var1;
    *(_Rb_tree_header **)
     ((long)&(__return_storage_ptr__->intoFunction).super_LazyVisit.visited._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) = p_Var1;
    (__return_storage_ptr__->intoFunction).super_LazyVisit.visited._M_t._M_impl.
    super__Rb_tree_header._M_node_count = 0;
    (__return_storage_ptr__->intoFunction).stack.
    super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->intoFunction).stack.
    super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->intoFunction).stack.
             super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->intoFunction).stack.
             super__Vector_base<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>,_std::allocator<std::tuple<dg::vr::VRLocation_*,_unsigned_int,_dg::vr::VREdge_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  }
  else {
    VRCodeGraphIterator::VRCodeGraphIterator
              (__return_storage_ptr__,*(_Base_ptr *)&this->field_0x30,
               (MappingIterator)&this->field_0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

VRCodeGraph::VRCodeGraphIterator VRCodeGraph::begin() const {
    return functionMapping.empty()
                   ? VRCodeGraphIterator()
                   : VRCodeGraphIterator(functionMapping.begin(),
                                         functionMapping.end());
}